

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<ArgumentDef>::copyAppend
          (QGenericArrayOps<ArgumentDef> *this,ArgumentDef *b,ArgumentDef *e)

{
  qsizetype *pqVar1;
  ArgumentDef *pAVar2;
  long lVar3;
  Data *pDVar4;
  TypeTags TVar5;
  Token TVar6;
  ReferenceType RVar7;
  
  if ((b != e) && (b < e)) {
    pAVar2 = (this->super_QArrayDataPointer<ArgumentDef>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<ArgumentDef>).size;
      pDVar4 = (b->type).name.d.d;
      pAVar2[lVar3].type.name.d.d = pDVar4;
      pAVar2[lVar3].type.name.d.ptr = (b->type).name.d.ptr;
      pAVar2[lVar3].type.name.d.size = (b->type).name.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar4 = (b->type).rawName.d.d;
      pAVar2[lVar3].type.rawName.d.d = pDVar4;
      pAVar2[lVar3].type.rawName.d.ptr = (b->type).rawName.d.ptr;
      pAVar2[lVar3].type.rawName.d.size = (b->type).rawName.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      TVar5.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
           (b->type).typeTag.super_QFlagsStorageHelper<TypeTag,_4>;
      TVar6 = (b->type).firstToken;
      RVar7 = (b->type).referenceType;
      *(undefined4 *)&pAVar2[lVar3].type.field_0x30 = *(undefined4 *)&(b->type).field_0x30;
      pAVar2[lVar3].type.typeTag =
           (TypeTags)TVar5.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i;
      pAVar2[lVar3].type.firstToken = TVar6;
      pAVar2[lVar3].type.referenceType = RVar7;
      pDVar4 = (b->rightType).d.d;
      pAVar2[lVar3].rightType.d.d = pDVar4;
      pAVar2[lVar3].rightType.d.ptr = (b->rightType).d.ptr;
      pAVar2[lVar3].rightType.d.size = (b->rightType).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->normalizedType).d.d;
      pAVar2[lVar3].normalizedType.d.d = pDVar4;
      pAVar2[lVar3].normalizedType.d.ptr = (b->normalizedType).d.ptr;
      pAVar2[lVar3].normalizedType.d.size = (b->normalizedType).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->name).d.d;
      pAVar2[lVar3].name.d.d = pDVar4;
      pAVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pAVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->typeNameForCast).d.d;
      pAVar2[lVar3].typeNameForCast.d.d = pDVar4;
      pAVar2[lVar3].typeNameForCast.d.ptr = (b->typeNameForCast).d.ptr;
      pAVar2[lVar3].typeNameForCast.d.size = (b->typeNameForCast).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pAVar2[lVar3].isDefault = b->isDefault;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<ArgumentDef>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }